

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeField
                    (FieldDescriptor *field,Message *message,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  int *piVar1;
  anon_union_8_2_4f9aec01_for_ShortSooRep_1 *paVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  byte extraout_AL;
  byte bVar6;
  uint uVar7;
  uint32_t uVar8;
  CppStringType CVar9;
  int iVar10;
  int iVar11;
  MapFieldBase *this;
  RepeatedField<double> *rhs;
  uint64_t uVar12;
  long lVar13;
  EnumValueDescriptor *pEVar14;
  string *psVar15;
  MessageLite *pMVar16;
  uint8_t *puVar17;
  RepeatedField<int> *pRVar18;
  RepeatedField<unsigned_int> *pRVar19;
  RepeatedField<long> *pRVar20;
  size_t sVar21;
  RepeatedField<float> *rhs_00;
  RepeatedField<unsigned_long> *pRVar22;
  RepeatedField<bool> *rhs_01;
  int *piVar23;
  anon_union_8_2_4f9aec01_for_ShortSooRep_1 *paVar24;
  ulong uVar25;
  ulong uVar26;
  string *psVar27;
  byte bVar28;
  uint uVar29;
  Reflection *this_00;
  uint uVar30;
  FileDescriptor *pFVar31;
  long lVar32;
  undefined1 *puVar33;
  char *in_R9;
  byte *pbVar34;
  int unaff_R14D;
  EpsCopyOutputStream *unaff_R15;
  float fVar35;
  double dVar36;
  string_view field_name;
  Metadata MVar37;
  MapValueConstRef map_value;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> sorted_key_list;
  undefined1 local_f8 [32];
  void *local_d8;
  long local_c8 [2];
  int local_b8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [32];
  CppType local_58;
  MapValueConstRef local_50;
  FileDescriptor *local_40;
  EnumDescriptor *local_38;
  
  MVar37 = Message::GetMetadata(message);
  this_00 = MVar37.reflection;
  bVar6 = field->field_0x1;
  if ((((bVar6 & 8) != 0) &&
      ((field->containing_type_->options_->field_0)._impl_.message_set_wire_format_ == true)) &&
     (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10)) {
    if (0xbf < bVar6 == (bool)((bVar6 & 0x20) >> 5)) {
      if ((bVar6 & 0x20) == 0) {
        puVar17 = InternalSerializeMessageSetItem(field,message,target,stream);
        return puVar17;
      }
      goto LAB_0032672d;
    }
    InternalSerializeField();
    pFVar31 = (FileDescriptor *)field;
LAB_00328b38:
    target = io::EpsCopyOutputStream::EnsureSpaceFallback(unaff_R15,target);
LAB_0032795a:
    iVar10 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
                          (local_f8._0_8_ & 4) == 0);
    if (unaff_R15->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
LAB_00328a8a:
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_98);
    }
    uVar30 = iVar10 << 3;
    uVar29 = unaff_R14D * 8 + 2;
    uVar7 = uVar29;
    if (0x7f < (uint)(unaff_R14D << 3)) {
      do {
        *target = (byte)uVar7 | 0x80;
        uVar29 = uVar7 >> 7;
        target = target + 1;
        bVar5 = 0x3fff < uVar7;
        uVar7 = uVar29;
      } while (bVar5);
    }
    *target = (byte)uVar29;
    pbVar34 = target + 1;
    uVar7 = uVar30;
    uVar29 = uVar30;
    if (0x7f < uVar30) {
      do {
        target = pbVar34;
        *target = (byte)uVar29 | 0x80;
        pbVar34 = target + 1;
        bVar5 = 0x3fff < uVar29;
        unaff_R15 = stream;
        uVar7 = uVar29 >> 7;
        uVar29 = uVar29 >> 7;
      } while (bVar5);
    }
    *pbVar34 = (byte)uVar7;
    if ((local_f8._0_8_ & 4) == 0) {
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
    }
    pbVar34 = target + 2;
    if ((long)unaff_R15->end_ - (long)pbVar34 < (long)(int)uVar30) {
      target = io::EpsCopyOutputStream::WriteRawFallback(unaff_R15,piVar23,uVar30,pbVar34);
    }
    else {
      memcpy(pbVar34,piVar23,(ulong)uVar30);
      target = pbVar34 + (int)uVar30;
    }
    goto LAB_00328167;
  }
LAB_0032672d:
  if ((field->type_ == '\v') && (bVar5 = FieldDescriptor::is_map_message_type(field), bVar5)) {
    this = Reflection::GetMapData(this_00,message,field);
    bVar5 = MapFieldBase::IsMapValid(this);
    if (!bVar5) goto LAB_00326800;
    if (stream->is_serialization_deterministic_ == true) {
      MapKeySorter::SortKey
                ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                 local_98,message,this_00,field);
      if (local_98._0_8_ != local_98._8_8_) {
        pFVar31 = (FileDescriptor *)local_98._0_8_;
        do {
          local_f8._0_8_ = 0;
          local_f8._8_4_ = 0;
          Reflection::LookupMapValue
                    (this_00,message,field,(MapKey *)pFVar31,
                     (MapValueConstRef *)
                     &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
          target = InternalSerializeMapEntry
                             (field,(MapKey *)pFVar31,
                              (MapValueConstRef *)
                              &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,target,
                              stream);
          pFVar31 = (FileDescriptor *)&pFVar31->dependencies_once_;
        } while (pFVar31 != (FileDescriptor *)local_98._8_8_);
      }
      std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::~vector
                ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                 local_98);
      return target;
    }
    Reflection::MapBegin((MapIterator *)local_98,this_00,message,field);
    while( true ) {
      Reflection::MapEnd((MapIterator *)
                         &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,this_00,
                         message,field);
      bVar5 = MapFieldBase::EqualIterator
                        ((MapFieldBase *)local_88._8_8_,(MapIterator *)local_98,
                         (MapIterator *)
                         &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
      if ((local_b8 == 9) && ((long *)local_d8 != local_c8)) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      if (bVar5) break;
      target = InternalSerializeMapEntry(field,(MapKey *)local_78,&local_50,target,stream);
      MapFieldBase::IncreaseIterator((MapFieldBase *)local_88._8_8_,(MapIterator *)local_98);
    }
    if (local_58 != CPPTYPE_STRING) {
      return target;
    }
    if ((FileDescriptor *)local_78._0_8_ == (FileDescriptor *)(local_78 + 0x10)) {
      return target;
    }
    puVar33 = (undefined1 *)(local_78._16_8_ + 1);
    goto LAB_003286a3;
  }
LAB_00326800:
  bVar6 = field->field_0x1;
  bVar28 = (bVar6 & 0x20) >> 5;
  if (0xbf < bVar6 != (bool)bVar28) {
    InternalSerializeField();
    bVar6 = extraout_AL;
LAB_003286d5:
    psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                        ((bool)bVar28,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
               ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
    goto LAB_00328a8a;
  }
  if ((bVar6 & 0x20) == 0) {
    if ((field->containing_type_->options_->field_0)._impl_.map_entry_ == false) {
      bVar5 = Reflection::HasField(this_00,message,field);
      uVar7 = (uint)bVar5;
    }
    else {
      uVar7 = 1;
    }
LAB_003268cc:
    pFVar31 = (FileDescriptor *)0x0;
    local_40 = (FileDescriptor *)0x0;
    local_a0 = 0;
  }
  else {
    uVar7 = Reflection::FieldSize(this_00,message,field);
    if (((int)uVar7 < 2) || (field->type_ != '\v')) goto LAB_003268cc;
    local_a0 = 0;
    bVar5 = FieldDescriptor::is_map_message_type(field);
    if ((!bVar5) || (stream->is_serialization_deterministic_ != true)) goto LAB_003268cc;
    DynamicMapSorter::Sort
              ((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                *)local_98,message,uVar7,this_00,field);
    local_40 = (FileDescriptor *)local_98._8_8_;
    local_a0 = CONCAT71(local_88._1_7_,local_88[0]);
    pFVar31 = (FileDescriptor *)local_98._0_8_;
  }
  bVar5 = FieldDescriptor::is_packed(field);
  local_78._0_8_ = pFVar31;
  if (!bVar5) {
    if (0 < (int)uVar7) {
      local_38 = (EnumDescriptor *)(ulong)uVar7;
      lVar32 = 0;
      do {
        if (stream->end_ <= target) {
          target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        iVar10 = (int)lVar32;
        switch(field->type_) {
        case '\x01':
          bVar6 = field->field_0x1;
          bVar5 = (bool)((bVar6 & 0x20) >> 5);
          if (0xbf < bVar6 == bVar5) {
            if ((bVar6 & 0x20) == 0) {
              dVar36 = Reflection::GetDouble(this_00,message,field);
            }
            else {
              dVar36 = Reflection::GetRepeatedDouble(this_00,message,field,iVar10);
            }
            uVar26 = (ulong)(field->number_ * 8 + 1);
            if (0x7f < (uint)(field->number_ << 3)) {
              do {
                uVar7 = (uint)uVar26;
                *target = (byte)uVar26 | 0x80;
                uVar26 = uVar26 >> 7;
                target = target + 1;
              } while (0x3fff < uVar7);
            }
            *target = (byte)uVar26;
            *(double *)(target + 1) = dVar36;
            goto LAB_00327241;
          }
          psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                              (bVar5,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_98,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_00328a8a;
        case '\x02':
          bVar6 = field->field_0x1;
          bVar5 = (bool)((bVar6 & 0x20) >> 5);
          if (0xbf < bVar6 == bVar5) {
            if ((bVar6 & 0x20) == 0) {
              fVar35 = Reflection::GetFloat(this_00,message,field);
            }
            else {
              fVar35 = Reflection::GetRepeatedFloat(this_00,message,field,iVar10);
            }
            uVar26 = (ulong)(field->number_ * 8 + 5);
            if (0x7f < (uint)(field->number_ << 3)) {
              do {
                uVar7 = (uint)uVar26;
                *target = (byte)uVar26 | 0x80;
                uVar26 = uVar26 >> 7;
                target = target + 1;
              } while (0x3fff < uVar7);
            }
            *target = (byte)uVar26;
            *(float *)(target + 1) = fVar35;
            goto LAB_003272c9;
          }
          psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                              (bVar5,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_98,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_00328a8a;
        case '\x03':
          bVar6 = field->field_0x1;
          bVar5 = (bool)((bVar6 & 0x20) >> 5);
          if (0xbf < bVar6 == bVar5) {
            if ((bVar6 & 0x20) == 0) {
              uVar25 = Reflection::GetInt64(this_00,message,field);
            }
            else {
              uVar25 = Reflection::GetRepeatedInt64(this_00,message,field,iVar10);
            }
            uVar29 = field->number_ << 3;
            uVar7 = uVar29;
            if (0x7f < uVar29) {
              do {
                *target = (byte)uVar7 | 0x80;
                uVar29 = uVar7 >> 7;
                target = target + 1;
                bVar5 = 0x3fff < uVar7;
                uVar7 = uVar29;
              } while (bVar5);
            }
            *target = (byte)uVar29;
            pbVar34 = target + 1;
            uVar26 = uVar25;
            if (0x7f < uVar25) {
              do {
                *pbVar34 = (byte)uVar26 | 0x80;
                uVar25 = uVar26 >> 7;
                pbVar34 = pbVar34 + 1;
                bVar5 = 0x3fff < uVar26;
                uVar26 = uVar25;
              } while (bVar5);
            }
            goto LAB_00327288;
          }
          psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                              (bVar5,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_98,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_00328a8a;
        case '\x04':
          bVar6 = field->field_0x1;
          bVar5 = (bool)((bVar6 & 0x20) >> 5);
          if (0xbf < bVar6 == bVar5) {
            if ((bVar6 & 0x20) == 0) {
              uVar25 = Reflection::GetUInt64(this_00,message,field);
            }
            else {
              uVar25 = Reflection::GetRepeatedUInt64(this_00,message,field,iVar10);
            }
            uVar29 = field->number_ << 3;
            uVar7 = uVar29;
            if (0x7f < uVar29) {
              do {
                *target = (byte)uVar7 | 0x80;
                uVar29 = uVar7 >> 7;
                target = target + 1;
                bVar5 = 0x3fff < uVar7;
                uVar7 = uVar29;
              } while (bVar5);
            }
            *target = (byte)uVar29;
            pbVar34 = target + 1;
            uVar26 = uVar25;
            if (0x7f < uVar25) {
              do {
                *pbVar34 = (byte)uVar26 | 0x80;
                uVar25 = uVar26 >> 7;
                pbVar34 = pbVar34 + 1;
                bVar5 = 0x3fff < uVar26;
                uVar26 = uVar25;
              } while (bVar5);
            }
            goto LAB_00327288;
          }
          psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                              (bVar5,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_98,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_00328a8a;
        case '\x05':
          bVar6 = field->field_0x1;
          bVar5 = (bool)((bVar6 & 0x20) >> 5);
          if (0xbf < bVar6 == bVar5) {
            if ((bVar6 & 0x20) == 0) {
              uVar7 = Reflection::GetInt32(this_00,message,field);
            }
            else {
              uVar7 = Reflection::GetRepeatedInt32(this_00,message,field,iVar10);
            }
            uVar30 = field->number_ << 3;
            uVar29 = uVar30;
            if (0x7f < uVar30) {
              do {
                *target = (byte)uVar29 | 0x80;
                uVar30 = uVar29 >> 7;
                target = target + 1;
                bVar5 = 0x3fff < uVar29;
                uVar29 = uVar30;
              } while (bVar5);
            }
            *target = (byte)uVar30;
            pbVar34 = target + 1;
            uVar25 = (ulong)(int)uVar7;
            uVar26 = uVar25;
            if (0x7f < uVar7) {
              do {
                *pbVar34 = (byte)uVar26 | 0x80;
                uVar25 = uVar26 >> 7;
                pbVar34 = pbVar34 + 1;
                bVar5 = 0x3fff < uVar26;
                uVar26 = uVar25;
              } while (bVar5);
            }
            *pbVar34 = (byte)uVar25;
            goto LAB_0032728c;
          }
          psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                              (bVar5,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_98,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_00328a8a;
        case '\x06':
          bVar6 = field->field_0x1;
          bVar5 = (bool)((bVar6 & 0x20) >> 5);
          if (0xbf < bVar6 == bVar5) {
            if ((bVar6 & 0x20) == 0) {
              uVar12 = Reflection::GetUInt64(this_00,message,field);
            }
            else {
              uVar12 = Reflection::GetRepeatedUInt64(this_00,message,field,iVar10);
            }
            uVar7 = field->number_ * 8 + 1;
            uVar26 = (ulong)uVar7;
            if ((uint)(field->number_ << 3) < 0x80) {
LAB_00327236:
              uVar26 = (ulong)uVar7;
            }
            else {
              do {
                uVar7 = (uint)uVar26;
                *target = (byte)uVar26 | 0x80;
                uVar26 = uVar26 >> 7;
                target = target + 1;
              } while (0x3fff < uVar7);
            }
            goto LAB_00327238;
          }
          psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                              (bVar5,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_98,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_00328a8a;
        case '\a':
          bVar6 = field->field_0x1;
          bVar28 = (bVar6 & 0x20) >> 5;
          if (0xbf < bVar6 == (bool)bVar28) {
            if ((bVar6 & 0x20) == 0) {
              uVar8 = Reflection::GetUInt32(this_00,message,field);
            }
            else {
              uVar8 = Reflection::GetRepeatedUInt32(this_00,message,field,iVar10);
            }
            uVar7 = field->number_ * 8 + 5;
            uVar26 = (ulong)uVar7;
            if ((uint)(field->number_ << 3) < 0x80) {
LAB_003272be:
              uVar26 = (ulong)uVar7;
            }
            else {
              do {
                uVar7 = (uint)uVar26;
                *target = (byte)uVar26 | 0x80;
                uVar26 = uVar26 >> 7;
                target = target + 1;
              } while (0x3fff < uVar7);
            }
            goto LAB_003272c0;
          }
          goto LAB_003286d5;
        case '\b':
          bVar6 = field->field_0x1;
          bVar5 = (bool)((bVar6 & 0x20) >> 5);
          if (0xbf < bVar6 != bVar5) {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar5,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_98,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
            goto LAB_00328a8a;
          }
          if ((bVar6 & 0x20) == 0) {
            bVar5 = Reflection::GetBool(this_00,message,field);
          }
          else {
            bVar5 = Reflection::GetRepeatedBool(this_00,message,field,iVar10);
          }
          uVar29 = field->number_ << 3;
          uVar7 = uVar29;
          if (0x7f < uVar29) {
            do {
              *target = (byte)uVar7 | 0x80;
              uVar29 = uVar7 >> 7;
              target = target + 1;
              bVar4 = 0x3fff < uVar7;
              uVar7 = uVar29;
            } while (bVar4);
          }
          *target = (byte)uVar29;
          target[1] = bVar5;
          target = target + 2;
          break;
        case '\t':
          FieldDescriptor::requires_utf8_validation(field);
          local_98._0_8_ = local_88;
          local_98._8_8_ = (FileDescriptor *)0x0;
          local_88[0] = '\0';
          bVar6 = field->field_0x1;
          bVar5 = (bool)((bVar6 & 0x20) >> 5);
          if (0xbf < bVar6 != bVar5) {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar5,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_f8,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
LAB_00328b16:
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)
                       &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
          }
          if ((bVar6 & 0x20) == 0) {
            psVar15 = Reflection::GetStringReference(this_00,message,field,(string *)local_98);
          }
          else {
            psVar15 = Reflection::GetRepeatedStringReference
                                (this_00,message,field,iVar10,(string *)local_98);
          }
          field_name._M_str = in_R9;
          field_name._M_len = (size_t)field->all_names_[1]._M_dataplus._M_p;
          WireFormatLite::VerifyUtf8String
                    ((WireFormatLite *)(psVar15->_M_dataplus)._M_p,
                     (char *)(ulong)(uint)psVar15->_M_string_length,1,
                     (Operation)field->all_names_[1]._M_string_length,field_name);
          sVar3 = psVar15->_M_string_length;
          if ((long)sVar3 < 0x80) {
            uVar7 = field->number_ * 8;
            lVar13 = 1;
            if (((0x7f < uVar7) && (lVar13 = 2, 0x3fff < uVar7)) && (lVar13 = 3, 0x1fffff < uVar7))
            {
              lVar13 = 5 - (ulong)(uVar7 < 0x10000000);
            }
            if ((long)(stream->end_ + ~(ulong)(target + lVar13) + 0x10) < (long)sVar3)
            goto LAB_00327589;
            uVar30 = uVar7 | 2;
            uVar29 = uVar30;
            if (0x7f < uVar7) {
              do {
                *target = (byte)uVar29 | 0x80;
                uVar30 = uVar29 >> 7;
                target = target + 1;
                bVar5 = 0x3fff < uVar29;
                uVar29 = uVar30;
              } while (bVar5);
            }
            *target = (byte)uVar30;
            target[1] = (byte)sVar3;
            memcpy(target + 2,(psVar15->_M_dataplus)._M_p,sVar3);
            target = target + sVar3 + 2;
          }
          else {
LAB_00327589:
            target = io::EpsCopyOutputStream::WriteStringOutline
                               (stream,field->number_,psVar15,target);
          }
          if ((FileDescriptor *)local_98._0_8_ != (FileDescriptor *)local_88) {
            operator_delete((void *)local_98._0_8_,CONCAT71(local_88._1_7_,local_88[0]) + 1);
          }
          break;
        case '\n':
          bVar6 = field->field_0x1;
          bVar5 = (bool)((bVar6 & 0x20) >> 5);
          if (0xbf < bVar6 != bVar5) {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar5,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_98,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
            goto LAB_00328a8a;
          }
          if ((bVar6 & 0x20) == 0) {
            pMVar16 = &Reflection::GetMessage(this_00,message,field,(MessageFactory *)0x0)->
                       super_MessageLite;
          }
          else if (pFVar31 == local_40) {
            pMVar16 = &Reflection::GetRepeatedMessage(this_00,message,field,iVar10)->
                       super_MessageLite;
          }
          else {
            pMVar16 = *(MessageLite **)((long)&pFVar31->super_SymbolBase + lVar32 * 8);
          }
          target = WireFormatLite::InternalWriteGroup(field->number_,pMVar16,target,stream);
          break;
        case '\v':
          bVar6 = field->field_0x1;
          bVar5 = (bool)((bVar6 & 0x20) >> 5);
          if (0xbf < bVar6 != bVar5) {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar5,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_98,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
            goto LAB_00328a8a;
          }
          if ((bVar6 & 0x20) == 0) {
            pMVar16 = &Reflection::GetMessage(this_00,message,field,(MessageFactory *)0x0)->
                       super_MessageLite;
          }
          else if (pFVar31 == local_40) {
            pMVar16 = &Reflection::GetRepeatedMessage(this_00,message,field,iVar10)->
                       super_MessageLite;
          }
          else {
            pMVar16 = *(MessageLite **)((long)&pFVar31->super_SymbolBase + lVar32 * 8);
          }
          iVar10 = field->number_;
          iVar11 = MessageLite::GetCachedSize(pMVar16);
          target = WireFormatLite::InternalWriteMessage(iVar10,pMVar16,iVar11,target,stream);
          break;
        case '\f':
          CVar9 = FieldDescriptor::cpp_string_type(field);
          if (CVar9 == kCord) {
            Reflection::GetCord((Reflection *)local_98,(Message *)this_00,(FieldDescriptor *)message
                               );
            target = io::EpsCopyOutputStream::WriteString
                               (stream,field->number_,(Cord *)local_98,target);
            absl::lts_20240722::Cord::~Cord((Cord *)local_98);
          }
          else {
            local_98._0_8_ = local_88;
            local_98._8_8_ = (FileDescriptor *)0x0;
            local_88[0] = '\0';
            bVar6 = field->field_0x1;
            bVar5 = (bool)((bVar6 & 0x20) >> 5);
            if (0xbf < bVar6 != bVar5) {
              psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar5,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
              absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_f8,
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                         ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
              goto LAB_00328b16;
            }
            if ((bVar6 & 0x20) == 0) {
              psVar15 = Reflection::GetStringReference(this_00,message,field,(string *)local_98);
            }
            else {
              psVar15 = Reflection::GetRepeatedStringReference
                                  (this_00,message,field,iVar10,(string *)local_98);
            }
            sVar3 = psVar15->_M_string_length;
            if ((long)sVar3 < 0x80) {
              uVar7 = field->number_ * 8;
              lVar13 = 1;
              if (((0x7f < uVar7) && (lVar13 = 2, 0x3fff < uVar7)) && (lVar13 = 3, 0x1fffff < uVar7)
                 ) {
                lVar13 = 5 - (ulong)(uVar7 < 0x10000000);
              }
              if ((long)(stream->end_ + ~(ulong)(target + lVar13) + 0x10) < (long)sVar3)
              goto LAB_003277be;
              uVar30 = uVar7 | 2;
              uVar29 = uVar30;
              if (0x7f < uVar7) {
                do {
                  *target = (byte)uVar29 | 0x80;
                  uVar30 = uVar29 >> 7;
                  target = target + 1;
                  bVar5 = 0x3fff < uVar29;
                  uVar29 = uVar30;
                } while (bVar5);
              }
              *target = (byte)uVar30;
              target[1] = (byte)sVar3;
              memcpy(target + 2,(psVar15->_M_dataplus)._M_p,sVar3);
              target = target + sVar3 + 2;
            }
            else {
LAB_003277be:
              target = io::EpsCopyOutputStream::WriteStringOutline
                                 (stream,field->number_,psVar15,target);
            }
            if ((FileDescriptor *)local_98._0_8_ != (FileDescriptor *)local_88) {
              operator_delete((void *)local_98._0_8_,CONCAT71(local_88._1_7_,local_88[0]) + 1);
            }
          }
          break;
        case '\r':
          bVar6 = field->field_0x1;
          bVar5 = (bool)((bVar6 & 0x20) >> 5);
          if (0xbf < bVar6 == bVar5) {
            if ((bVar6 & 0x20) == 0) {
              uVar29 = Reflection::GetUInt32(this_00,message,field);
            }
            else {
              uVar29 = Reflection::GetRepeatedUInt32(this_00,message,field,iVar10);
            }
            uVar30 = field->number_ << 3;
            uVar7 = uVar30;
            if (0x7f < uVar30) {
              do {
                *target = (byte)uVar7 | 0x80;
                uVar30 = uVar7 >> 7;
                target = target + 1;
                bVar5 = 0x3fff < uVar7;
                uVar7 = uVar30;
              } while (bVar5);
            }
            *target = (byte)uVar30;
            pbVar34 = target + 1;
            uVar7 = uVar29;
            if (0x7f < uVar29) {
              do {
                *pbVar34 = (byte)uVar7 | 0x80;
                uVar29 = uVar7 >> 7;
                pbVar34 = pbVar34 + 1;
                bVar5 = 0x3fff < uVar7;
                uVar7 = uVar29;
              } while (bVar5);
            }
            goto LAB_00326fd6;
          }
          psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                              (bVar5,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_98,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_00328a8a;
        case '\x0e':
          bVar6 = field->field_0x1;
          bVar5 = (bool)((bVar6 & 0x20) >> 5);
          if (0xbf < bVar6 == bVar5) {
            if ((bVar6 & 0x20) == 0) {
              pEVar14 = Reflection::GetEnum(this_00,message,field);
            }
            else {
              pEVar14 = Reflection::GetRepeatedEnum(this_00,message,field,iVar10);
            }
            uVar7 = pEVar14->number_;
            uVar25 = (ulong)(int)uVar7;
            uVar30 = field->number_ << 3;
            uVar29 = uVar30;
            if (0x7f < uVar30) {
              do {
                *target = (byte)uVar29 | 0x80;
                uVar30 = uVar29 >> 7;
                target = target + 1;
                bVar5 = 0x3fff < uVar29;
                uVar29 = uVar30;
              } while (bVar5);
            }
            *target = (byte)uVar30;
            pbVar34 = target + 1;
            uVar26 = uVar25;
            if (0x7f < uVar7) {
              do {
                *pbVar34 = (byte)uVar26 | 0x80;
                uVar25 = uVar26 >> 7;
                pbVar34 = pbVar34 + 1;
                bVar5 = 0x3fff < uVar26;
                uVar26 = uVar25;
              } while (bVar5);
            }
            goto LAB_00327288;
          }
          psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                              (bVar5,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_98,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_00328a8a;
        case '\x0f':
          bVar6 = field->field_0x1;
          bVar5 = (bool)((bVar6 & 0x20) >> 5);
          if (0xbf < bVar6 != bVar5) {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar5,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_98,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
            goto LAB_00328a8a;
          }
          if ((bVar6 & 0x20) == 0) {
            uVar8 = Reflection::GetInt32(this_00,message,field);
          }
          else {
            uVar8 = Reflection::GetRepeatedInt32(this_00,message,field,iVar10);
          }
          uVar7 = field->number_ * 8 + 5;
          if ((uint)(field->number_ << 3) < 0x80) goto LAB_003272be;
          uVar26 = (ulong)uVar7;
          do {
            uVar7 = (uint)uVar26;
            *target = (byte)uVar26 | 0x80;
            uVar26 = uVar26 >> 7;
            target = target + 1;
          } while (0x3fff < uVar7);
LAB_003272c0:
          *target = (byte)uVar26;
          *(uint32_t *)(target + 1) = uVar8;
LAB_003272c9:
          target = target + 5;
          break;
        case '\x10':
          bVar6 = field->field_0x1;
          bVar5 = (bool)((bVar6 & 0x20) >> 5);
          if (0xbf < bVar6 != bVar5) {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar5,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_98,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
            goto LAB_00328a8a;
          }
          if ((bVar6 & 0x20) == 0) {
            uVar12 = Reflection::GetInt64(this_00,message,field);
          }
          else {
            uVar12 = Reflection::GetRepeatedInt64(this_00,message,field,iVar10);
          }
          uVar7 = field->number_ * 8 + 1;
          if ((uint)(field->number_ << 3) < 0x80) goto LAB_00327236;
          uVar26 = (ulong)uVar7;
          do {
            uVar7 = (uint)uVar26;
            *target = (byte)uVar26 | 0x80;
            uVar26 = uVar26 >> 7;
            target = target + 1;
          } while (0x3fff < uVar7);
LAB_00327238:
          *target = (byte)uVar26;
          *(uint64_t *)(target + 1) = uVar12;
LAB_00327241:
          target = target + 9;
          break;
        case '\x11':
          bVar6 = field->field_0x1;
          bVar5 = (bool)((bVar6 & 0x20) >> 5);
          if (0xbf < bVar6 == bVar5) {
            if ((bVar6 & 0x20) == 0) {
              iVar10 = Reflection::GetInt32(this_00,message,field);
            }
            else {
              iVar10 = Reflection::GetRepeatedInt32(this_00,message,field,iVar10);
            }
            uVar29 = field->number_ << 3;
            uVar7 = uVar29;
            if (0x7f < uVar29) {
              do {
                *target = (byte)uVar7 | 0x80;
                uVar29 = uVar7 >> 7;
                target = target + 1;
                bVar5 = 0x3fff < uVar7;
                uVar7 = uVar29;
              } while (bVar5);
            }
            *target = (byte)uVar29;
            pbVar34 = target + 1;
            uVar29 = iVar10 >> 0x1f ^ iVar10 * 2;
            uVar7 = uVar29;
            if (0x7f < uVar29) {
              do {
                *pbVar34 = (byte)uVar7 | 0x80;
                uVar29 = uVar7 >> 7;
                pbVar34 = pbVar34 + 1;
                bVar5 = 0x3fff < uVar7;
                uVar7 = uVar29;
              } while (bVar5);
            }
LAB_00326fd6:
            *pbVar34 = (byte)uVar29;
            goto LAB_0032728c;
          }
          psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                              (bVar5,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_98,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_00328a8a;
        case '\x12':
          bVar6 = field->field_0x1;
          bVar5 = (bool)((bVar6 & 0x20) >> 5);
          if (0xbf < bVar6 != bVar5) {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar5,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED");
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_98,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
            goto LAB_00328a8a;
          }
          if ((bVar6 & 0x20) == 0) {
            lVar13 = Reflection::GetInt64(this_00,message,field);
          }
          else {
            lVar13 = Reflection::GetRepeatedInt64(this_00,message,field,iVar10);
          }
          uVar29 = field->number_ << 3;
          uVar7 = uVar29;
          if (0x7f < uVar29) {
            do {
              *target = (byte)uVar7 | 0x80;
              uVar29 = uVar7 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar7;
              uVar7 = uVar29;
            } while (bVar5);
          }
          *target = (byte)uVar29;
          pbVar34 = target + 1;
          uVar25 = lVar13 >> 0x3f ^ lVar13 * 2;
          uVar26 = uVar25;
          if (0x7f < uVar25) {
            do {
              *pbVar34 = (byte)uVar26 | 0x80;
              uVar25 = uVar26 >> 7;
              pbVar34 = pbVar34 + 1;
              bVar5 = 0x3fff < uVar26;
              uVar26 = uVar25;
            } while (bVar5);
          }
LAB_00327288:
          *pbVar34 = (byte)uVar25;
LAB_0032728c:
          target = pbVar34 + 1;
        }
        lVar32 = lVar32 + 1;
      } while ((EnumDescriptor *)lVar32 != local_38);
    }
    goto LAB_00328693;
  }
  if (uVar7 == 0) goto LAB_00328693;
  if (stream->end_ <= target) {
    target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  switch(field->type_) {
  case '\x01':
    rhs = Reflection::GetRepeatedFieldInternal<double>(this_00,message,field);
    RepeatedField<double>::RepeatedField
              ((RepeatedField<double> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,(Arena *)0x0,rhs);
    iVar10 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar11 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
                          (local_f8._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_00328a8a;
    }
    uVar7 = iVar11 << 3;
    uVar26 = (ulong)(iVar10 * 8 + 2);
    if (0x7f < (uint)(iVar10 << 3)) {
      do {
        uVar29 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar29);
    }
    *target = (byte)uVar26;
    pbVar34 = target + 1;
    uVar29 = uVar7;
    uVar30 = uVar7;
    if (0x7f < uVar7) {
      do {
        target = pbVar34;
        *target = (byte)uVar30 | 0x80;
        pbVar34 = target + 1;
        bVar5 = 0x3fff < uVar30;
        uVar29 = uVar30 >> 7;
        uVar30 = uVar30 >> 7;
      } while (bVar5);
    }
    *pbVar34 = (byte)uVar29;
    if ((local_f8._0_8_ & 4) == 0) {
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
    }
    pbVar34 = target + 2;
    if ((long)stream->end_ - (long)pbVar34 < (long)(int)uVar7) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar23,uVar7,pbVar34);
    }
    else {
      memcpy(pbVar34,piVar23,(ulong)uVar7);
      target = pbVar34 + (int)uVar7;
    }
    RepeatedField<double>::~RepeatedField
              ((RepeatedField<double> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
    break;
  case '\x02':
    rhs_00 = Reflection::GetRepeatedFieldInternal<float>(this_00,message,field);
    RepeatedField<float>::RepeatedField
              ((RepeatedField<float> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,(Arena *)0x0,rhs_00);
    iVar10 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar11 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
                          (local_f8._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_00328a8a;
    }
    uVar7 = iVar11 << 2;
    uVar26 = (ulong)(iVar10 * 8 + 2);
    if (0x7f < (uint)(iVar10 << 3)) {
      do {
        uVar29 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar29);
    }
    *target = (byte)uVar26;
    pbVar34 = target + 1;
    uVar29 = uVar7;
    uVar30 = uVar7;
    if (0x7f < uVar7) {
      do {
        target = pbVar34;
        *target = (byte)uVar30 | 0x80;
        pbVar34 = target + 1;
        bVar5 = 0x3fff < uVar30;
        uVar29 = uVar30 >> 7;
        uVar30 = uVar30 >> 7;
      } while (bVar5);
    }
    *pbVar34 = (byte)uVar29;
    if ((local_f8._0_8_ & 4) == 0) {
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
    }
    pbVar34 = target + 2;
    if ((long)stream->end_ - (long)pbVar34 < (long)(int)uVar7) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar23,uVar7,pbVar34);
    }
    else {
      memcpy(pbVar34,piVar23,(ulong)uVar7);
      target = pbVar34 + (int)uVar7;
    }
    RepeatedField<float>::~RepeatedField
              ((RepeatedField<float> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
    break;
  case '\x03':
    pRVar20 = Reflection::GetRepeatedFieldInternal<long>(this_00,message,field);
    RepeatedField<long>::RepeatedField
              ((RepeatedField<long> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep
               ,(Arena *)0x0,pRVar20);
    iVar10 = field->number_;
    sVar21 = FieldDataOnlyByteSize(field,message);
    pbVar34 = stream->end_;
    if (pbVar34 <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar34 = stream->end_;
    }
    if (pbVar34 <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_00328a8a;
    }
    uVar26 = (ulong)(iVar10 * 8 + 2);
    if (0x7f < (uint)(iVar10 << 3)) {
      do {
        uVar7 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar7);
    }
    *target = (byte)uVar26;
    pbVar34 = target + 1;
    if (0x7f < (uint)sVar21) {
      do {
        target = pbVar34;
        uVar7 = (uint)sVar21;
        *target = (byte)sVar21 | 0x80;
        sVar21 = (size_t)(uVar7 >> 7);
        pbVar34 = target + 1;
      } while (0x3fff < uVar7);
    }
    *pbVar34 = (byte)sVar21;
    if ((local_f8._0_8_ & 4) == 0) {
      bVar5 = true;
      paVar24 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->short_rep).field_1;
    }
    else {
      paVar24 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1 *)
                LongSooRep::elements(&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep)
      ;
      bVar5 = (local_f8._0_8_ & 4) == 0;
    }
    iVar10 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
                          bVar5);
    target = target + 2;
    paVar2 = paVar24 + iVar10;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar26 = *(ulong *)paVar24->data;
      uVar25 = uVar26;
      if (0x7f < uVar26) {
        do {
          *target = (byte)uVar25 | 0x80;
          uVar26 = uVar25 >> 7;
          target = target + 1;
          bVar5 = 0x3fff < uVar25;
          uVar25 = uVar26;
        } while (bVar5);
      }
      paVar24 = paVar24 + 1;
      *target = (byte)uVar26;
      target = target + 1;
    } while (paVar24 < paVar2);
    goto LAB_00328167;
  case '\x04':
    pRVar22 = Reflection::GetRepeatedFieldInternal<unsigned_long>(this_00,message,field);
    RepeatedField<unsigned_long>::RepeatedField
              ((RepeatedField<unsigned_long> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,(Arena *)0x0,pRVar22);
    iVar10 = field->number_;
    sVar21 = FieldDataOnlyByteSize(field,message);
    pbVar34 = stream->end_;
    if (pbVar34 <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar34 = stream->end_;
    }
    if (pbVar34 <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_00328a8a;
    }
    uVar26 = (ulong)(iVar10 * 8 + 2);
    if (0x7f < (uint)(iVar10 << 3)) {
      do {
        uVar7 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar7);
    }
    *target = (byte)uVar26;
    pbVar34 = target + 1;
    if (0x7f < (uint)sVar21) {
      do {
        target = pbVar34;
        uVar7 = (uint)sVar21;
        *target = (byte)sVar21 | 0x80;
        sVar21 = (size_t)(uVar7 >> 7);
        pbVar34 = target + 1;
      } while (0x3fff < uVar7);
    }
    *pbVar34 = (byte)sVar21;
    if ((local_f8._0_8_ & 4) == 0) {
      bVar5 = true;
      paVar24 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->short_rep).field_1;
    }
    else {
      paVar24 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1 *)
                LongSooRep::elements(&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep)
      ;
      bVar5 = (local_f8._0_8_ & 4) == 0;
    }
    iVar10 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
                          bVar5);
    target = target + 2;
    paVar2 = paVar24 + iVar10;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar26 = *(ulong *)paVar24->data;
      uVar25 = uVar26;
      if (0x7f < uVar26) {
        do {
          *target = (byte)uVar25 | 0x80;
          uVar26 = uVar25 >> 7;
          target = target + 1;
          bVar5 = 0x3fff < uVar25;
          uVar25 = uVar26;
        } while (bVar5);
      }
      paVar24 = paVar24 + 1;
      *target = (byte)uVar26;
      target = target + 1;
    } while (paVar24 < paVar2);
    goto LAB_003284c0;
  case '\x05':
    pRVar18 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
               (Arena *)0x0,pRVar18);
    iVar10 = field->number_;
    sVar21 = FieldDataOnlyByteSize(field,message);
    pbVar34 = stream->end_;
    if (pbVar34 <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar34 = stream->end_;
    }
    if (pbVar34 <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_00328a8a;
    }
    uVar26 = (ulong)(iVar10 * 8 + 2);
    if (0x7f < (uint)(iVar10 << 3)) {
      do {
        uVar7 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar7);
    }
    *target = (byte)uVar26;
    pbVar34 = target + 1;
    if (0x7f < (uint)sVar21) {
      do {
        target = pbVar34;
        uVar7 = (uint)sVar21;
        *target = (byte)sVar21 | 0x80;
        sVar21 = (size_t)(uVar7 >> 7);
        pbVar34 = target + 1;
      } while (0x3fff < uVar7);
    }
    *pbVar34 = (byte)sVar21;
    if ((local_f8._0_8_ & 4) == 0) {
      bVar5 = true;
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
      bVar5 = (local_f8._0_8_ & 4) == 0;
    }
    iVar10 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
                          bVar5);
    target = target + 2;
    piVar1 = piVar23 + iVar10;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar25 = (ulong)*piVar23;
      uVar26 = uVar25;
      if (0x7f < uVar25) {
        do {
          *target = (byte)uVar26 | 0x80;
          uVar25 = uVar26 >> 7;
          target = target + 1;
          bVar5 = 0x3fff < uVar26;
          uVar26 = uVar25;
        } while (bVar5);
      }
      piVar23 = piVar23 + 1;
      *target = (byte)uVar25;
      target = target + 1;
    } while (piVar23 < piVar1);
    goto LAB_003282ae;
  case '\x06':
    pRVar22 = Reflection::GetRepeatedFieldInternal<unsigned_long>(this_00,message,field);
    RepeatedField<unsigned_long>::RepeatedField
              ((RepeatedField<unsigned_long> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,(Arena *)0x0,pRVar22);
    iVar10 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar11 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
                          (local_f8._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_00328a8a;
    }
    uVar7 = iVar11 << 3;
    uVar26 = (ulong)(iVar10 * 8 + 2);
    if (0x7f < (uint)(iVar10 << 3)) {
      do {
        uVar29 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar29);
    }
    *target = (byte)uVar26;
    pbVar34 = target + 1;
    uVar29 = uVar7;
    uVar30 = uVar7;
    if (0x7f < uVar7) {
      do {
        target = pbVar34;
        *target = (byte)uVar30 | 0x80;
        pbVar34 = target + 1;
        bVar5 = 0x3fff < uVar30;
        uVar29 = uVar30 >> 7;
        uVar30 = uVar30 >> 7;
      } while (bVar5);
    }
    *pbVar34 = (byte)uVar29;
    if ((local_f8._0_8_ & 4) == 0) {
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
    }
    pbVar34 = target + 2;
    if ((long)stream->end_ - (long)pbVar34 < (long)(int)uVar7) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar23,uVar7,pbVar34);
    }
    else {
      memcpy(pbVar34,piVar23,(ulong)uVar7);
      target = pbVar34 + (int)uVar7;
    }
LAB_003284c0:
    RepeatedField<unsigned_long>::~RepeatedField
              ((RepeatedField<unsigned_long> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
    break;
  case '\a':
    pRVar19 = Reflection::GetRepeatedFieldInternal<unsigned_int>(this_00,message,field);
    RepeatedField<unsigned_int>::RepeatedField
              ((RepeatedField<unsigned_int> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,(Arena *)0x0,pRVar19);
    iVar10 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar11 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
                          (local_f8._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_00328a8a;
    }
    uVar7 = iVar11 << 2;
    uVar26 = (ulong)(iVar10 * 8 + 2);
    if (0x7f < (uint)(iVar10 << 3)) {
      do {
        uVar29 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar29);
    }
    *target = (byte)uVar26;
    pbVar34 = target + 1;
    uVar29 = uVar7;
    uVar30 = uVar7;
    if (0x7f < uVar7) {
      do {
        target = pbVar34;
        *target = (byte)uVar30 | 0x80;
        pbVar34 = target + 1;
        bVar5 = 0x3fff < uVar30;
        uVar29 = uVar30 >> 7;
        uVar30 = uVar30 >> 7;
      } while (bVar5);
    }
    *pbVar34 = (byte)uVar29;
    if ((local_f8._0_8_ & 4) == 0) {
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
    }
    pbVar34 = target + 2;
    if ((long)stream->end_ - (long)pbVar34 < (long)(int)uVar7) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar23,uVar7,pbVar34);
    }
    else {
      memcpy(pbVar34,piVar23,(ulong)uVar7);
      target = pbVar34 + (int)uVar7;
    }
    goto LAB_00328686;
  case '\b':
    rhs_01 = Reflection::GetRepeatedFieldInternal<bool>(this_00,message,field);
    RepeatedField<bool>::RepeatedField
              ((RepeatedField<bool> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep
               ,(Arena *)0x0,rhs_01);
    iVar10 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
                         (local_f8._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_00328a8a;
    }
    uVar26 = (ulong)(iVar10 * 8 + 2);
    if (0x7f < (uint)(iVar10 << 3)) {
      do {
        uVar29 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar29);
    }
    *target = (byte)uVar26;
    pbVar34 = target + 1;
    uVar29 = uVar7;
    uVar30 = uVar7;
    if (0x7f < uVar7) {
      do {
        target = pbVar34;
        *target = (byte)uVar30 | 0x80;
        pbVar34 = target + 1;
        bVar5 = 0x3fff < uVar30;
        uVar29 = uVar30 >> 7;
        uVar30 = uVar30 >> 7;
      } while (bVar5);
    }
    *pbVar34 = (byte)uVar29;
    if ((local_f8._0_8_ & 4) == 0) {
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
    }
    pbVar34 = target + 2;
    if ((long)stream->end_ - (long)pbVar34 < (long)(int)uVar7) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar23,uVar7,pbVar34);
    }
    else {
      memcpy(pbVar34,piVar23,(ulong)uVar7);
      target = pbVar34 + (int)uVar7;
    }
    RepeatedField<bool>::~RepeatedField
              ((RepeatedField<bool> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep
              );
    break;
  default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/wire_format.cc"
               ,0x539);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)local_98,(char (*) [19])"Invalid descriptor");
    goto LAB_00328a8a;
  case '\r':
    pRVar19 = Reflection::GetRepeatedFieldInternal<unsigned_int>(this_00,message,field);
    RepeatedField<unsigned_int>::RepeatedField
              ((RepeatedField<unsigned_int> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,(Arena *)0x0,pRVar19);
    iVar10 = field->number_;
    sVar21 = FieldDataOnlyByteSize(field,message);
    pbVar34 = stream->end_;
    if (pbVar34 <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar34 = stream->end_;
    }
    if (pbVar34 <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_00328a8a;
    }
    uVar26 = (ulong)(iVar10 * 8 + 2);
    if (0x7f < (uint)(iVar10 << 3)) {
      do {
        uVar7 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar7);
    }
    *target = (byte)uVar26;
    pbVar34 = target + 1;
    if (0x7f < (uint)sVar21) {
      do {
        target = pbVar34;
        uVar7 = (uint)sVar21;
        *target = (byte)sVar21 | 0x80;
        sVar21 = (size_t)(uVar7 >> 7);
        pbVar34 = target + 1;
      } while (0x3fff < uVar7);
    }
    *pbVar34 = (byte)sVar21;
    if ((local_f8._0_8_ & 4) == 0) {
      bVar5 = true;
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
      bVar5 = (local_f8._0_8_ & 4) == 0;
    }
    iVar10 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
                          bVar5);
    target = target + 2;
    piVar1 = piVar23 + iVar10;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar7 = *piVar23;
      uVar29 = uVar7;
      if (0x7f < uVar7) {
        do {
          *target = (byte)uVar29 | 0x80;
          uVar7 = uVar29 >> 7;
          target = target + 1;
          bVar5 = 0x3fff < uVar29;
          uVar29 = uVar7;
        } while (bVar5);
      }
      piVar23 = piVar23 + 1;
      *target = (byte)uVar7;
      target = target + 1;
    } while (piVar23 < piVar1);
LAB_00328686:
    RepeatedField<unsigned_int>::~RepeatedField
              ((RepeatedField<unsigned_int> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
    break;
  case '\x0e':
    pRVar18 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
               (Arena *)0x0,pRVar18);
    iVar10 = field->number_;
    sVar21 = FieldDataOnlyByteSize(field,message);
    pbVar34 = stream->end_;
    if (pbVar34 <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar34 = stream->end_;
    }
    if (pbVar34 <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_00328a8a;
    }
    uVar26 = (ulong)(iVar10 * 8 + 2);
    if (0x7f < (uint)(iVar10 << 3)) {
      do {
        uVar7 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar7);
    }
    *target = (byte)uVar26;
    pbVar34 = target + 1;
    if (0x7f < (uint)sVar21) {
      do {
        target = pbVar34;
        uVar7 = (uint)sVar21;
        *target = (byte)sVar21 | 0x80;
        sVar21 = (size_t)(uVar7 >> 7);
        pbVar34 = target + 1;
      } while (0x3fff < uVar7);
    }
    *pbVar34 = (byte)sVar21;
    if ((local_f8._0_8_ & 4) == 0) {
      bVar5 = true;
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
      bVar5 = (local_f8._0_8_ & 4) == 0;
    }
    iVar10 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
                          bVar5);
    target = target + 2;
    piVar1 = piVar23 + iVar10;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar25 = (ulong)*piVar23;
      uVar26 = uVar25;
      if (0x7f < uVar25) {
        do {
          *target = (byte)uVar26 | 0x80;
          uVar25 = uVar26 >> 7;
          target = target + 1;
          bVar5 = 0x3fff < uVar26;
          uVar26 = uVar25;
        } while (bVar5);
      }
      piVar23 = piVar23 + 1;
      *target = (byte)uVar25;
      target = target + 1;
    } while (piVar23 < piVar1);
    goto LAB_003282ae;
  case '\x0f':
    pRVar18 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
               (Arena *)0x0,pRVar18);
    iVar10 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar11 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
                          (local_f8._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_00328a8a;
    }
    uVar7 = iVar11 << 2;
    uVar26 = (ulong)(iVar10 * 8 + 2);
    if (0x7f < (uint)(iVar10 << 3)) {
      do {
        uVar29 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar29);
    }
    *target = (byte)uVar26;
    pbVar34 = target + 1;
    uVar29 = uVar7;
    uVar30 = uVar7;
    if (0x7f < uVar7) {
      do {
        target = pbVar34;
        *target = (byte)uVar30 | 0x80;
        pbVar34 = target + 1;
        bVar5 = 0x3fff < uVar30;
        uVar29 = uVar30 >> 7;
        uVar30 = uVar30 >> 7;
      } while (bVar5);
    }
    *pbVar34 = (byte)uVar29;
    if ((local_f8._0_8_ & 4) == 0) {
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
    }
    pbVar34 = target + 2;
    if ((long)stream->end_ - (long)pbVar34 < (long)(int)uVar7) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar23,uVar7,pbVar34);
    }
    else {
      memcpy(pbVar34,piVar23,(ulong)uVar7);
      target = pbVar34 + (int)uVar7;
    }
    goto LAB_003282ae;
  case '\x10':
    pRVar20 = Reflection::GetRepeatedFieldInternal<long>(this_00,message,field);
    RepeatedField<long>::RepeatedField
              ((RepeatedField<long> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep
               ,(Arena *)0x0,pRVar20);
    unaff_R14D = field->number_;
    unaff_R15 = stream;
    if (stream->end_ <= target) goto LAB_00328b38;
    goto LAB_0032795a;
  case '\x11':
    pRVar18 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
               (Arena *)0x0,pRVar18);
    iVar10 = field->number_;
    sVar21 = FieldDataOnlyByteSize(field,message);
    pbVar34 = stream->end_;
    if (pbVar34 <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar34 = stream->end_;
    }
    if (pbVar34 <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_00328a8a;
    }
    uVar26 = (ulong)(iVar10 * 8 + 2);
    if (0x7f < (uint)(iVar10 << 3)) {
      do {
        uVar7 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar7);
    }
    *target = (byte)uVar26;
    pbVar34 = target + 1;
    if (0x7f < (uint)sVar21) {
      do {
        target = pbVar34;
        uVar7 = (uint)sVar21;
        *target = (byte)sVar21 | 0x80;
        sVar21 = (size_t)(uVar7 >> 7);
        pbVar34 = target + 1;
      } while (0x3fff < uVar7);
    }
    *pbVar34 = (byte)sVar21;
    if ((local_f8._0_8_ & 4) == 0) {
      bVar5 = true;
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep);
      bVar5 = (local_f8._0_8_ & 4) == 0;
    }
    iVar10 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
                          bVar5);
    target = target + 2;
    piVar1 = piVar23 + iVar10;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar29 = *piVar23 >> 0x1f ^ *piVar23 * 2;
      uVar7 = uVar29;
      if (0x7f < uVar29) {
        do {
          *target = (byte)uVar7 | 0x80;
          uVar29 = uVar7 >> 7;
          target = target + 1;
          bVar5 = 0x3fff < uVar7;
          uVar7 = uVar29;
        } while (bVar5);
      }
      piVar23 = piVar23 + 1;
      *target = (byte)uVar29;
      target = target + 1;
    } while (piVar23 < piVar1);
LAB_003282ae:
    RepeatedField<int>::~RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep)
    ;
    break;
  case '\x12':
    pRVar20 = Reflection::GetRepeatedFieldInternal<long>(this_00,message,field);
    RepeatedField<long>::RepeatedField
              ((RepeatedField<long> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep
               ,(Arena *)0x0,pRVar20);
    iVar10 = field->number_;
    sVar21 = FieldDataOnlyByteSize(field,message);
    pbVar34 = stream->end_;
    if (pbVar34 <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar34 = stream->end_;
    }
    if (pbVar34 <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_00328a8a;
    }
    uVar26 = (ulong)(iVar10 * 8 + 2);
    if (0x7f < (uint)(iVar10 << 3)) {
      do {
        uVar7 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar7);
    }
    *target = (byte)uVar26;
    pbVar34 = target + 1;
    if (0x7f < (uint)sVar21) {
      do {
        target = pbVar34;
        uVar7 = (uint)sVar21;
        *target = (byte)sVar21 | 0x80;
        sVar21 = (size_t)(uVar7 >> 7);
        pbVar34 = target + 1;
      } while (0x3fff < uVar7);
    }
    *pbVar34 = (byte)sVar21;
    if ((local_f8._0_8_ & 4) == 0) {
      bVar5 = true;
      paVar24 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->short_rep).field_1;
    }
    else {
      paVar24 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1 *)
                LongSooRep::elements(&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep)
      ;
      bVar5 = (local_f8._0_8_ & 4) == 0;
    }
    iVar10 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep,
                          bVar5);
    target = target + 2;
    paVar2 = paVar24 + iVar10;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar25 = *(long *)paVar24->data >> 0x3f ^ *(long *)paVar24->data * 2;
      uVar26 = uVar25;
      if (0x7f < uVar25) {
        do {
          *target = (byte)uVar26 | 0x80;
          uVar25 = uVar26 >> 7;
          target = target + 1;
          bVar5 = 0x3fff < uVar26;
          uVar26 = uVar25;
        } while (bVar5);
      }
      paVar24 = paVar24 + 1;
      *target = (byte)uVar25;
      target = target + 1;
    } while (paVar24 < paVar2);
LAB_00328167:
    RepeatedField<long>::~RepeatedField
              ((RepeatedField<long> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_f8)->long_rep
              );
    local_78._0_8_ = pFVar31;
  }
LAB_00328693:
  if ((FileDescriptor *)local_78._0_8_ != (FileDescriptor *)0x0) {
    puVar33 = (undefined1 *)(local_a0 - local_78._0_8_);
LAB_003286a3:
    operator_delete((void *)local_78._0_8_,(ulong)puVar33);
  }
  return target;
}

Assistant:

uint8_t* WireFormat::InternalSerializeField(const FieldDescriptor* field,
                                            const Message& message,
                                            uint8_t* target,
                                            io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return InternalSerializeMessageSetItem(field, message, target, stream);
  }


  // For map fields, we can use either repeated field reflection or map
  // reflection.  Our choice has some subtle effects.  If we use repeated field
  // reflection here, then the repeated field representation becomes
  // authoritative for this field: any existing references that came from map
  // reflection remain valid for reading, but mutations to them are lost and
  // will be overwritten next time we call map reflection!
  //
  // So far this mainly affects Python, which keeps long-term references to map
  // values around, and always uses map reflection.  See: b/35918691
  //
  // Here we choose to use map reflection API as long as the internal
  // map is valid. In this way, the serialization doesn't change map field's
  // internal state and existing references that came from map reflection remain
  // valid for both reading and writing.
  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      if (stream->IsSerializationDeterministic()) {
        std::vector<MapKey> sorted_key_list =
            MapKeySorter::SortKey(message, message_reflection, field);
        for (std::vector<MapKey>::iterator it = sorted_key_list.begin();
             it != sorted_key_list.end(); ++it) {
          MapValueConstRef map_value;
          message_reflection->LookupMapValue(message, field, *it, &map_value);
          target =
              InternalSerializeMapEntry(field, *it, map_value, target, stream);
        }
      } else {
        for (MapIterator it = message_reflection->MapBegin(
                 const_cast<Message*>(&message), field);
             it !=
             message_reflection->MapEnd(const_cast<Message*>(&message), field);
             ++it) {
          target = InternalSerializeMapEntry(field, it.GetKey(),
                                             it.GetValueRef(), target, stream);
        }
      }

      return target;
    }
  }
  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  // map_entries is for maps that'll be deterministically serialized.
  std::vector<const Message*> map_entries;
  if (count > 1 && field->is_map() && stream->IsSerializationDeterministic()) {
    map_entries =
        DynamicMapSorter::Sort(message, count, message_reflection, field);
  }

  if (field->is_packed()) {
    if (count == 0) return target;
    target = stream->EnsureSpace(target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    auto r =                                                                   \
        message_reflection->GetRepeatedFieldInternal<CPPTYPE>(message, field); \
    target = stream->Write##TYPE_METHOD##Packed(                               \
        field->number(), r, FieldDataOnlyByteSize(field, message), target);    \
    break;                                                                     \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32_t, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64_t, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32_t, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64_t, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t, UInt64, UInt64)
      HANDLE_PRIMITIVE_TYPE(ENUM, int, Enum, Enum)

#undef HANDLE_PRIMITIVE_TYPE
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    auto r =                                                                   \
        message_reflection->GetRepeatedFieldInternal<CPPTYPE>(message, field); \
    target = stream->WriteFixedPacked(field->number(), r, target);             \
    break;                                                                     \
  }

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32_t, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64_t, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32_t, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64_t, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE
      default:
        ABSL_LOG(FATAL) << "Invalid descriptor";
    }
    return target;
  }

  auto get_message_from_field = [&message, &map_entries, message_reflection](
                                    const FieldDescriptor* field, int j) {
    if (!field->is_repeated()) {
      return &message_reflection->GetMessage(message, field);
    }
    if (!map_entries.empty()) {
      return map_entries[j];
    }
    return &message_reflection->GetRepeatedMessage(message, field, j);
  };
  for (int j = 0; j < count; j++) {
    target = stream->EnsureSpace(target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)     \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    const CPPTYPE value =                                                     \
        field->is_repeated()                                                  \
            ? message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                              j)              \
            : message_reflection->Get##CPPTYPE_METHOD(message, field);        \
    target = WireFormatLite::Write##TYPE_METHOD##ToArray(field->number(),     \
                                                         value, target);      \
    break;                                                                    \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32_t, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64_t, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32_t, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64_t, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32_t, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64_t, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32_t, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64_t, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

      case FieldDescriptor::TYPE_GROUP: {
        auto* msg = get_message_from_field(field, j);
        target = WireFormatLite::InternalWriteGroup(field->number(), *msg,
                                                    target, stream);
      } break;

      case FieldDescriptor::TYPE_MESSAGE: {
        auto* msg = get_message_from_field(field, j);
        target = WireFormatLite::InternalWriteMessage(
            field->number(), *msg, msg->GetCachedSize(), target, stream);
      } break;

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value =
            field->is_repeated()
                ? message_reflection->GetRepeatedEnum(message, field, j)
                : message_reflection->GetEnum(message, field);
        target = WireFormatLite::WriteEnumToArray(field->number(),
                                                  value->number(), target);
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = field->requires_utf8_validation();
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        if (strict_utf8_check) {
          WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                           WireFormatLite::SERIALIZE,
                                           field->full_name());
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), SERIALIZE,
                                     field->full_name());
        }
        target = stream->WriteString(field->number(), value, target);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
          absl::Cord value = message_reflection->GetCord(message, field);
          target = stream->WriteString(field->number(), value, target);
          break;
        }
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        target = stream->WriteString(field->number(), value, target);
        break;
      }
    }
  }
  return target;
}